

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall TiXmlPrinter::Visit(TiXmlPrinter *this,TiXmlText *text)

{
  bool bVar1;
  char *suffix;
  TiXmlString *pTVar2;
  TiXmlString local_38;
  TiXmlString str_1;
  TiXmlString local_20;
  TiXmlString str;
  TiXmlText *text_local;
  TiXmlPrinter *this_local;
  
  str.rep_ = (Rep *)text;
  bVar1 = TiXmlText::CDATA(text);
  if (bVar1) {
    DoIndent(this);
    TiXmlString::operator+=(&this->buffer,"<![CDATA[");
    suffix = TiXmlNode::Value((TiXmlNode *)str.rep_);
    TiXmlString::operator+=(&this->buffer,suffix);
    TiXmlString::operator+=(&this->buffer,"]]>");
    DoLineBreak(this);
  }
  else if ((this->simpleTextPrint & 1U) == 0) {
    DoIndent(this);
    TiXmlString::TiXmlString(&local_38);
    pTVar2 = TiXmlNode::ValueTStr((TiXmlNode *)str.rep_);
    TiXmlBase::EncodeString(pTVar2,&local_38);
    TiXmlString::operator+=(&this->buffer,&local_38);
    DoLineBreak(this);
    TiXmlString::~TiXmlString(&local_38);
  }
  else {
    TiXmlString::TiXmlString(&local_20);
    pTVar2 = TiXmlNode::ValueTStr((TiXmlNode *)str.rep_);
    TiXmlBase::EncodeString(pTVar2,&local_20);
    TiXmlString::operator+=(&this->buffer,&local_20);
    TiXmlString::~TiXmlString(&local_20);
  }
  return true;
}

Assistant:

bool TiXmlPrinter::Visit( const TiXmlText& text )
{
	if ( text.CDATA() )
	{
		DoIndent();
		buffer += "<![CDATA[";
		buffer += text.Value();
		buffer += "]]>";
		DoLineBreak();
	}
	else if ( simpleTextPrint )
	{
		TIXML_STRING str;
		TiXmlBase::EncodeString( text.ValueTStr(), &str );
		buffer += str;
	}
	else
	{
		DoIndent();
		TIXML_STRING str;
		TiXmlBase::EncodeString( text.ValueTStr(), &str );
		buffer += str;
		DoLineBreak();
	}
	return true;
}